

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Callbacks>
::
find<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Entry,capnp::_::(anonymous_namespace)::TestVat*&>
          (HashIndex<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Callbacks>
           *this,ArrayPtr<kj::HashMap<const_capnp::_::(anonymous_namespace)::TestVat_*,_capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*>::Entry>
                 table,TestVat **params)

{
  ulong in_RAX;
  TestVat **ppTVar1;
  Entry *pEVar2;
  uint in_R8D;
  int in_register_00000084;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  Maybe<unsigned_long> MVar7;
  Maybe<unsigned_long> MVar8;
  
  MVar8.ptr.field_1.value = table.size_;
  pEVar2 = table.ptr;
  if (MVar8.ptr.field_1.value == 0) {
    *this = (HashIndex<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Callbacks>
             )0x0;
    MVar7.ptr.field_1.value = 0;
    MVar7.ptr._0_8_ = in_RAX;
    return (Maybe<unsigned_long>)MVar7.ptr;
  }
  if (in_register_00000084 == 0) {
    uVar3 = in_R8D * 0x8000 + ~in_R8D;
    uVar3 = (uVar3 >> 0xc ^ uVar3) * 5;
    uVar3 = (uVar3 >> 4 ^ uVar3) * 0x809;
    uVar3 = uVar3 >> 0x10 ^ uVar3;
  }
  else {
    uVar4 = CONCAT44(in_register_00000084,in_R8D) * 0x40000 + ~CONCAT44(in_register_00000084,in_R8D)
    ;
    uVar4 = (uVar4 >> 0x1f ^ uVar4) * 0x15;
    uVar4 = (uVar4 >> 0xb ^ uVar4) * 0x41;
    uVar3 = (uint)(uVar4 >> 0x16) ^ (uint)uVar4;
  }
  MVar8.ptr._4_4_ = 0;
  MVar8.ptr._0_4_ = uVar3;
  uVar4 = (ulong)((int)table.size_ - 1U & uVar3);
  uVar6 = *(uint *)((long)&pEVar2->key + uVar4 * 8 + 4);
  if (uVar6 != 0) {
    ppTVar1 = &pEVar2->key + uVar4;
    do {
      if (((uVar6 != 1) && (*(uint *)ppTVar1 == uVar3)) &&
         (params[(ulong)(uVar6 - 2) * 2] == (TestVat *)CONCAT44(in_register_00000084,in_R8D))) {
        *this = (HashIndex<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Callbacks>
                 )0x1;
        *(ulong *)(this + 8) = (ulong)(uVar6 - 2);
        goto LAB_001fcb95;
      }
      uVar5 = uVar4 + 1;
      uVar4 = uVar5 & 0xffffffff;
      if (uVar5 == MVar8.ptr.field_1.value) {
        uVar4 = 0;
      }
      ppTVar1 = &pEVar2->key + uVar4;
      uVar6 = *(uint *)((long)ppTVar1 + 4);
    } while (uVar6 != 0);
  }
  *this = (HashIndex<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Callbacks>
           )0x0;
LAB_001fcb95:
  return (Maybe<unsigned_long>)MVar8.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }